

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_textedit_discard_undo(nk_text_undo_state *state)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  ushort uVar4;
  long lVar5;
  ushort uVar6;
  
  uVar4 = state->undo_point;
  if (0 < (short)uVar4) {
    if (-1 < state->undo_rec[0].char_storage) {
      sVar1 = state->undo_rec[0].insert_length;
      uVar3 = state->undo_char_point;
      state->undo_char_point = uVar3 - sVar1;
      nk_memcopy(state->undo_char,state->undo_char + sVar1,(long)(short)(uVar3 - sVar1) << 2);
      uVar4 = state->undo_point;
      lVar5 = 0;
      uVar6 = uVar4;
      if ((short)uVar4 < 1) {
        uVar6 = 0;
      }
      for (; (ulong)uVar6 * 0xc - lVar5 != 0; lVar5 = lVar5 + 0xc) {
        sVar2 = *(short *)((long)&state->undo_rec[0].char_storage + lVar5);
        if (-1 < sVar2) {
          *(short *)((long)&state->undo_rec[0].char_storage + lVar5) = sVar2 - sVar1;
        }
      }
    }
    state->undo_point = uVar4 - 1;
    nk_memcopy(state,state->undo_rec + 1,(long)(short)(uVar4 - 1) * 0xc);
    return;
  }
  return;
}

Assistant:

NK_INTERN void
nk_textedit_discard_undo(struct nk_text_undo_state *state)
{
    /* discard the oldest entry in the undo list */
    if (state->undo_point > 0) {
        /* if the 0th undo state has characters, clean those up */
        if (state->undo_rec[0].char_storage >= 0) {
            int n = state->undo_rec[0].insert_length, i;
            /* delete n characters from all other records */
            state->undo_char_point = (short)(state->undo_char_point - n);
            NK_MEMCPY(state->undo_char, state->undo_char + n,
                (nk_size)state->undo_char_point*sizeof(nk_rune));
            for (i=0; i < state->undo_point; ++i) {
                if (state->undo_rec[i].char_storage >= 0)
                state->undo_rec[i].char_storage = (short)
                    (state->undo_rec[i].char_storage - n);
            }
        }
        --state->undo_point;
        NK_MEMCPY(state->undo_rec, state->undo_rec+1,
            (nk_size)((nk_size)state->undo_point * sizeof(state->undo_rec[0])));
    }
}